

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * wasm::saturating_narrow<short>(Literal *__return_storage_ptr__,type val)

{
  short sVar1;
  undefined4 local_14;
  type val_local;
  
  sVar1 = std::numeric_limits<short>::max();
  if (sVar1 < val) {
    sVar1 = std::numeric_limits<short>::max();
    local_14 = (type)sVar1;
  }
  else {
    sVar1 = std::numeric_limits<short>::min();
    local_14 = val;
    if (val < sVar1) {
      sVar1 = std::numeric_limits<short>::min();
      local_14 = (type)sVar1;
    }
  }
  Literal::Literal(__return_storage_ptr__,local_14);
  return __return_storage_ptr__;
}

Assistant:

Literal saturating_narrow(
  typename TwiceWidth<typename std::make_signed<T>::type>::type val) {
  using WideT = typename TwiceWidth<typename std::make_signed<T>::type>::type;
  if (val > WideT(std::numeric_limits<T>::max())) {
    val = std::numeric_limits<T>::max();
  } else if (val < WideT(std::numeric_limits<T>::min())) {
    val = std::numeric_limits<T>::min();
  }
  return Literal(int32_t(val));
}